

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_publisher.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  tm *__tp;
  size_t sVar4;
  char *pcVar5;
  char *addr;
  int local_e4c;
  char *local_e48;
  pthread_t client_daemon;
  char **local_e38;
  time_t timer;
  char timebuf [26];
  mqtt_client client;
  char application_message [256];
  uint8_t recvbuf [1024];
  uint8_t sendbuf [2048];
  
  local_e48 = "datetime";
  pcVar5 = "1883";
  if (argc < 2) {
    addr = "test.mosquitto.org";
  }
  else {
    addr = argv[1];
    if ((argc != 2) && (pcVar5 = argv[2], 3 < (uint)argc)) {
      local_e48 = argv[3];
    }
  }
  iVar2 = open_nb_socket(addr,pcVar5);
  if (iVar2 == -1) {
    perror("Failed to open socket: ");
    exit(1);
  }
  mqtt_init(&client,iVar2,sendbuf,0x800,recvbuf,0x400,publish_callback);
  mqtt_connect(&client,(char *)0x0,(char *)0x0,(void *)0x0,0,(char *)0x0,(char *)0x0,'\x02',400);
  pFVar1 = _stderr;
  if (client.error == MQTT_OK) {
    iVar3 = pthread_create(&client_daemon,(pthread_attr_t *)0x0,client_refresher,&client);
    if (iVar3 == 0) {
      local_e38 = (char **)addr;
      printf("%s is ready to begin publishing the time.\n",*argv);
      puts("Press ENTER to publish the current time.");
      puts("Press CTRL-D (or any other key) to exit.\n");
      do {
        iVar3 = fgetc(_stdin);
        addr = (char *)argv;
        local_e4c = iVar2;
        if (iVar3 != 10) goto LAB_0010165a;
        time(&timer);
        __tp = localtime(&timer);
        strftime(timebuf,0x1a,"%Y-%m-%d %H:%M:%S",__tp);
        snprintf(application_message,0x100,"The time is %s",timebuf);
        printf("%s published : \"%s\"",*argv,application_message);
        sVar4 = strlen(application_message);
        mqtt_publish(&client,local_e48,application_message,sVar4 + 1,'\0');
        pFVar1 = _stderr;
      } while (client.error == MQTT_OK);
      pcVar5 = mqtt_error_str(client.error);
      fprintf(pFVar1,"error: %s\n",pcVar5);
      iVar2 = 1;
      goto LAB_0010167f;
    }
    fwrite("Failed to start client daemon.\n",0x1f,1,_stderr);
  }
  else {
    pcVar5 = mqtt_error_str(client.error);
    fprintf(pFVar1,"error: %s\n",pcVar5);
  }
  exit_example(1,iVar2,(pthread_t *)0x0);
LAB_0010165a:
  printf("\n%s disconnecting from %s\n",*(char **)addr,local_e38);
  sleep(1);
  iVar2 = 0;
LAB_0010167f:
  exit_example(iVar2,local_e4c,&client_daemon);
  return extraout_EAX;
}

Assistant:

int main(int argc, const char *argv[])
{
    const char* addr;
    const char* port;
    const char* topic;

    /* get address (argv[1] if present) */
    if (argc > 1) {
        addr = argv[1];
    } else {
        addr = "test.mosquitto.org";
    }

    /* get port number (argv[2] if present) */
    if (argc > 2) {
        port = argv[2];
    } else {
        port = "1883";
    }

    /* get the topic name to publish */
    if (argc > 3) {
        topic = argv[3];
    } else {
        topic = "datetime";
    }

    /* open the non-blocking TCP socket (connecting to the broker) */
    int sockfd = open_nb_socket(addr, port);

    if (sockfd == -1) {
        perror("Failed to open socket: ");
        exit_example(EXIT_FAILURE, sockfd, NULL);
    }

    /* setup a client */
    struct mqtt_client client;
    uint8_t sendbuf[2048]; /* sendbuf should be large enough to hold multiple whole mqtt messages */
    uint8_t recvbuf[1024]; /* recvbuf should be large enough any whole mqtt message expected to be received */
    mqtt_init(&client, sockfd, sendbuf, sizeof(sendbuf), recvbuf, sizeof(recvbuf), publish_callback);
    /* Create an anonymous session */
    const char* client_id = NULL;
    /* Ensure we have a clean session */
    uint8_t connect_flags = MQTT_CONNECT_CLEAN_SESSION;
    /* Send connection request to the broker. */
    mqtt_connect(&client, client_id, NULL, NULL, 0, NULL, NULL, connect_flags, 400);

    /* check that we don't have any errors */
    if (client.error != MQTT_OK) {
        fprintf(stderr, "error: %s\n", mqtt_error_str(client.error));
        exit_example(EXIT_FAILURE, sockfd, NULL);
    }

    /* start a thread to refresh the client (handle egress and ingree client traffic) */
    pthread_t client_daemon;
    if(pthread_create(&client_daemon, NULL, client_refresher, &client)) {
        fprintf(stderr, "Failed to start client daemon.\n");
        exit_example(EXIT_FAILURE, sockfd, NULL);

    }

    /* start publishing the time */
    printf("%s is ready to begin publishing the time.\n", argv[0]);
    printf("Press ENTER to publish the current time.\n");
    printf("Press CTRL-D (or any other key) to exit.\n\n");
    while(fgetc(stdin) == '\n') {
        /* get the current time */
        time_t timer;
        time(&timer);
        struct tm* tm_info = localtime(&timer);
        char timebuf[26];
        strftime(timebuf, 26, "%Y-%m-%d %H:%M:%S", tm_info);

        /* print a message */
        char application_message[256];
        snprintf(application_message, sizeof(application_message), "The time is %s", timebuf);
        printf("%s published : \"%s\"", argv[0], application_message);

        /* publish the time */
        mqtt_publish(&client, topic, application_message, strlen(application_message) + 1, MQTT_PUBLISH_QOS_0);

        /* check for errors */
        if (client.error != MQTT_OK) {
            fprintf(stderr, "error: %s\n", mqtt_error_str(client.error));
            exit_example(EXIT_FAILURE, sockfd, &client_daemon);
        }
    }

    /* disconnect */
    printf("\n%s disconnecting from %s\n", argv[0], addr);
    sleep(1);

    /* exit */
    exit_example(EXIT_SUCCESS, sockfd, &client_daemon);
}